

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

void format_time(unsigned_long time,char *str,uint len)

{
  ulong uVar1;
  unsigned_long hours;
  unsigned_long minutes;
  unsigned_long secs;
  unsigned_long ms;
  uint len_local;
  char *str_local;
  unsigned_long time_local;
  
  uVar1 = (time / 1000) / 0x3c;
  snprintf(str,(ulong)len,"%.2lu:%.2lu:%.2lu+%.3lu",uVar1 / 0x3c,uVar1 % 0x3c,(time / 1000) % 0x3c,
           time % 1000);
  return;
}

Assistant:

void format_time(unsigned long time, char *str, unsigned int len) {
    unsigned long ms = time % 1000;
    time /= 1000;
    unsigned long secs = time % 60;
    time /= 60;
    unsigned long minutes = time % 60;
    time /= 60;
    unsigned long hours = time;

    snprintf(str, len, "%.2lu:%.2lu:%.2lu+%.3lu", hours, minutes, secs, ms);
}